

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O2

MultiSampleState * __thiscall
vkt::Draw::PipelineCreateInfo::MultiSampleState::operator=
          (MultiSampleState *this,MultiSampleState *other)

{
  ulong uVar1;
  uint *__first;
  allocator_type local_29;
  vector<unsigned_int,std::allocator<unsigned_int>> local_28 [24];
  
  (this->super_VkPipelineMultisampleStateCreateInfo).sType =
       (other->super_VkPipelineMultisampleStateCreateInfo).sType;
  (this->super_VkPipelineMultisampleStateCreateInfo).pNext =
       (other->super_VkPipelineMultisampleStateCreateInfo).pNext;
  (this->super_VkPipelineMultisampleStateCreateInfo).flags =
       (other->super_VkPipelineMultisampleStateCreateInfo).flags;
  uVar1._0_4_ = (other->super_VkPipelineMultisampleStateCreateInfo).rasterizationSamples;
  uVar1._4_4_ = (other->super_VkPipelineMultisampleStateCreateInfo).sampleShadingEnable;
  (this->super_VkPipelineMultisampleStateCreateInfo).rasterizationSamples = (undefined4)uVar1;
  (this->super_VkPipelineMultisampleStateCreateInfo).sampleShadingEnable = uVar1._4_4_;
  (this->super_VkPipelineMultisampleStateCreateInfo).minSampleShading =
       (other->super_VkPipelineMultisampleStateCreateInfo).minSampleShading;
  __first = (other->super_VkPipelineMultisampleStateCreateInfo).pSampleMask;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::vector<unsigned_int_const*,void>
            (local_28,__first,__first + ((uVar1 & 0xffffffff) + 0x20 >> 5),&local_29);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            (&this->m_sampleMask,local_28);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_28);
  (this->super_VkPipelineMultisampleStateCreateInfo).pSampleMask =
       (this->m_sampleMask).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  return this;
}

Assistant:

PipelineCreateInfo::MultiSampleState& PipelineCreateInfo::MultiSampleState::operator= (const MultiSampleState& other)
{
	sType = other.sType;
	pNext = other.pNext;
	flags					= other.flags;
	rasterizationSamples	= other.rasterizationSamples;
	sampleShadingEnable		= other.sampleShadingEnable;
	minSampleShading		= other.minSampleShading;

	const size_t sampleMaskArrayLen = (sizeof(vk::VkSampleMask) * 8 + other.rasterizationSamples) / (sizeof(vk::VkSampleMask) * 8);

	m_sampleMask	= std::vector<vk::VkSampleMask>(other.pSampleMask, other.pSampleMask + sampleMaskArrayLen);
	pSampleMask		= &m_sampleMask[0];

	return *this;
}